

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::init<Kernel::Literal*>
          (FastGeneralizationsIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  byte bVar1;
  Literal *in_RCX;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDX;
  FastGeneralizationsIterator *in_RSI;
  Literal *in_RDI;
  byte in_R8B;
  byte in_R9B;
  GenMatcher *in_stack_ffffffffffffffc0;
  InstanceCntr local_31;
  undefined1 local_30 [14];
  byte local_22;
  byte reversed_00;
  Literal *lit;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this_00;
  anon_class_8_1_8991fb9c bindSpecialVar;
  
  reversed_00 = in_R8B & 1;
  local_22 = in_R9B & 1;
  *(byte *)&(in_RDI->super_Term)._vptr_Term = reversed_00;
  lit = in_RCX;
  this_00 = in_RDX;
  bindSpecialVar.this = in_RSI;
  bVar1 = (*(code *)(*(IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> **)in_RDX)[1].
                    _vptr_IteratorCore)();
  *(byte *)((long)&(in_RDI->super_Term)._vptr_Term + 1) = bVar1 & 1;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
  init<Kernel::Literal*>(in_stack_ffffffffffffffc0,in_RDI,(uint)((ulong)in_RSI >> 0x20));
  if (((ulong)(in_RDI->super_Term)._vptr_Term & 0x100) == 0) {
    Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::getEmpty();
  }
  else {
    (*(code *)(*(IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> **)this_00)[4].
              _vptr_IteratorCore)(local_30);
  }
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::operator=
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)in_RSI,
             (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)in_RDX);
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::~VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)in_RCX);
  *(SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> **)&in_RDI[3].super_Term._weight
       = this_00;
  InstanceCntr::InstanceCntr(&local_31,(Cntr *)&((bindSpecialVar.this)->_subst)._boundVars._stack);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastGeneralizationsIterator::init<Kernel::Literal*>(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (this_00,lit,(bool)reversed_00,bindSpecialVar);
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _subst.init(query, parent->_nextVar);
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;

        _iterCntr = parent->_iterCnt;
        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });
      }